

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O0

void Fl::flush(void)

{
  Fl_Widget *this;
  uchar uVar1;
  int iVar2;
  Fl_Window *wi;
  Fl_X *i;
  
  iVar2 = damage();
  if (iVar2 != 0) {
    damage_ = 0;
    for (wi = (Fl_Window *)Fl_X::first; wi != (Fl_Window *)0x0;
        wi = *(Fl_Window **)&(wi->super_Fl_Group).super_Fl_Widget.x_) {
      if ((char)(wi->super_Fl_Group).super_Fl_Widget.w_ == '\0') {
        this = (Fl_Widget *)(wi->super_Fl_Group).super_Fl_Widget.callback_;
        iVar2 = Fl_Widget::visible_r(this);
        if (iVar2 != 0) {
          uVar1 = Fl_Widget::damage(this);
          if (uVar1 != '\0') {
            Fl_X::flush((Fl_X *)wi);
            Fl_Widget::clear_damage(this,'\0');
          }
          if ((wi->super_Fl_Group).super_Fl_Widget.user_data_ != (void *)0x0) {
            XDestroyRegion((wi->super_Fl_Group).super_Fl_Widget.user_data_);
            (wi->super_Fl_Group).super_Fl_Widget.user_data_ = (void *)0x0;
          }
        }
      }
      else {
        damage_ = 1;
      }
    }
  }
  if (fl_display != (Display *)0x0) {
    XFlush(fl_display);
  }
  return;
}

Assistant:

void Fl::flush() {
  if (damage()) {
    damage_ = 0;
    for (Fl_X* i = Fl_X::first; i; i = i->next) {
      if (i->wait_for_expose) {damage_ = 1; continue;}
      Fl_Window* wi = i->w;
      if (!wi->visible_r()) continue;
      if (wi->damage()) {i->flush(); wi->clear_damage();}
      // destroy damage regions for windows that don't use them:
      if (i->region) {XDestroyRegion(i->region); i->region = 0;}
    }
  }
#if defined(USE_X11)
  if (fl_display) XFlush(fl_display);
#elif defined(WIN32)
  GdiFlush();
#elif defined (__APPLE_QUARTZ__)
  if (fl_gc)
    CGContextFlush(fl_gc);
#else
# error unsupported platform
#endif
}